

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.h
# Opt level: O0

_Bool is_conid_start_char(int32_t c)

{
  _Bool _Var1;
  int32_t c_local;
  
  if (c < bitmap_conid_start_1_min_codepoint) {
    _Var1 = false;
  }
  else if (bitmap_conid_start_1_max_codepoint < c) {
    if (c < bitmap_conid_start_2_min_codepoint) {
      _Var1 = false;
    }
    else if (bitmap_conid_start_2_max_codepoint < c) {
      if (c < bitmap_conid_start_3_min_codepoint) {
        _Var1 = false;
      }
      else if (bitmap_conid_start_3_max_codepoint < c) {
        if (c < bitmap_conid_start_4_min_codepoint) {
          _Var1 = false;
        }
        else if (bitmap_conid_start_4_max_codepoint < c) {
          if (c < bitmap_conid_start_5_min_codepoint) {
            _Var1 = false;
          }
          else if (bitmap_conid_start_5_max_codepoint < c) {
            _Var1 = false;
          }
          else {
            _Var1 = is_conid_start_5_char(c);
          }
        }
        else {
          _Var1 = is_conid_start_4_char(c);
        }
      }
      else {
        _Var1 = is_conid_start_3_char(c);
      }
    }
    else {
      _Var1 = is_conid_start_2_char(c);
    }
  }
  else {
    _Var1 = is_conid_start_1_char(c);
  }
  return _Var1 != false;
}

Assistant:

static bool is_conid_start_char(int32_t c) {
  return
    c < bitmap_conid_start_1_min_codepoint ? false :
    c <= bitmap_conid_start_1_max_codepoint ? is_conid_start_1_char(c) :
    c < bitmap_conid_start_2_min_codepoint ? false :
    c <= bitmap_conid_start_2_max_codepoint ? is_conid_start_2_char(c) :
    c < bitmap_conid_start_3_min_codepoint ? false :
    c <= bitmap_conid_start_3_max_codepoint ? is_conid_start_3_char(c) :
    c < bitmap_conid_start_4_min_codepoint ? false :
    c <= bitmap_conid_start_4_max_codepoint ? is_conid_start_4_char(c) :
    c < bitmap_conid_start_5_min_codepoint ? false :
    c <= bitmap_conid_start_5_max_codepoint ? is_conid_start_5_char(c) :
    false;
}